

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  
  bVar11 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar5 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar6 = (long)cdef_directions_padded[(long)dir + 2][1];
  auVar21._0_2_ = (undefined2)pri_strength;
  if (block_width == 8) {
    uVar7 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar7 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar7 = 0;
      }
    }
    auVar21._2_2_ = auVar21._0_2_;
    auVar21._4_2_ = auVar21._0_2_;
    auVar21._6_2_ = auVar21._0_2_;
    auVar21._8_2_ = auVar21._0_2_;
    auVar21._10_2_ = auVar21._0_2_;
    auVar21._12_2_ = auVar21._0_2_;
    auVar21._14_2_ = auVar21._0_2_;
    auVar21._16_2_ = auVar21._0_2_;
    auVar21._18_2_ = auVar21._0_2_;
    auVar21._20_2_ = auVar21._0_2_;
    auVar21._22_2_ = auVar21._0_2_;
    auVar21._24_2_ = auVar21._0_2_;
    auVar21._26_2_ = auVar21._0_2_;
    auVar21._28_2_ = auVar21._0_2_;
    auVar21._30_2_ = auVar21._0_2_;
    auVar12._8_2_ = 8;
    auVar12._0_8_ = 0x8000800080008;
    auVar12._10_2_ = 8;
    auVar12._12_2_ = 8;
    auVar12._14_2_ = 8;
    auVar12._16_2_ = 8;
    auVar12._18_2_ = 8;
    auVar12._20_2_ = 8;
    auVar12._22_2_ = 8;
    auVar12._24_2_ = 8;
    auVar12._26_2_ = 8;
    auVar12._28_2_ = 8;
    auVar12._30_2_ = 8;
    for (lVar8 = 0; lVar8 < block_height; lVar8 = lVar8 + 2) {
      auVar14._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])in +
           ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
      auVar14._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar5 * 2));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar5 * 2));
      auVar19._16_16_ = auVar13;
      auVar19._0_16_ = auVar16;
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar5 * -2));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar5 * -2 + 0x120));
      auVar27._16_16_ = auVar13;
      auVar27._0_16_ = auVar16;
      auVar20 = vpsubw_avx2(auVar19,auVar14);
      auVar40 = vpsraw_avx2(auVar20,0xf);
      auVar20 = vpabsw_avx2(auVar20);
      auVar31 = vpsrlw_avx2(auVar20,ZEXT416(uVar7));
      auVar31 = vpsubusw_avx2(auVar21,auVar31);
      auVar20 = vpminsw_avx2(auVar20,auVar31);
      auVar31 = vpaddw_avx2(auVar20,auVar40);
      auVar28 = vpsubw_avx2(auVar27,auVar14);
      auVar20 = vpabsw_avx2(auVar28);
      auVar33 = vpsrlw_avx2(auVar20,ZEXT416(uVar7));
      auVar28 = vpsraw_avx2(auVar28,0xf);
      auVar33 = vpsubusw_avx2(auVar21,auVar33);
      auVar20 = vpminsw_avx2(auVar20,auVar33);
      auVar20 = vpaddw_avx2(auVar20,auVar28);
      auVar20 = vpaddw_avx2(auVar20 ^ auVar28,auVar31 ^ auVar40);
      uVar1 = (undefined2)cdef_pri_taps[bVar11][0];
      auVar29._2_2_ = uVar1;
      auVar29._0_2_ = uVar1;
      auVar29._4_2_ = uVar1;
      auVar29._6_2_ = uVar1;
      auVar29._8_2_ = uVar1;
      auVar29._10_2_ = uVar1;
      auVar29._12_2_ = uVar1;
      auVar29._14_2_ = uVar1;
      auVar29._16_2_ = uVar1;
      auVar29._18_2_ = uVar1;
      auVar29._20_2_ = uVar1;
      auVar29._22_2_ = uVar1;
      auVar29._24_2_ = uVar1;
      auVar29._26_2_ = uVar1;
      auVar29._28_2_ = uVar1;
      auVar29._30_2_ = uVar1;
      auVar33 = vpmullw_avx2(auVar20,auVar29);
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar6 * 2));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar6 * 2));
      auVar30._16_16_ = auVar13;
      auVar30._0_16_ = auVar16;
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar6 * -2));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar6 * -2 + 0x120));
      auVar41._16_16_ = auVar13;
      auVar41._0_16_ = auVar16;
      auVar20 = vpsubw_avx2(auVar30,auVar14);
      auVar48 = vpsraw_avx2(auVar20,0xf);
      auVar20 = vpabsw_avx2(auVar20);
      auVar31 = vpsrlw_avx2(auVar20,ZEXT416(uVar7));
      auVar31 = vpsubusw_avx2(auVar21,auVar31);
      auVar20 = vpminsw_avx2(auVar31,auVar20);
      auVar31 = vpaddw_avx2(auVar20,auVar48);
      auVar40 = vpsubw_avx2(auVar41,auVar14);
      auVar20 = vpabsw_avx2(auVar40);
      auVar28 = vpsrlw_avx2(auVar20,ZEXT416(uVar7));
      auVar40 = vpsraw_avx2(auVar40,0xf);
      auVar28 = vpsubusw_avx2(auVar21,auVar28);
      auVar20 = vpminsw_avx2(auVar28,auVar20);
      auVar20 = vpaddw_avx2(auVar20,auVar40);
      auVar20 = vpaddw_avx2(auVar20 ^ auVar40,auVar31 ^ auVar48);
      uVar1 = (undefined2)cdef_pri_taps[bVar11][1];
      auVar42._2_2_ = uVar1;
      auVar42._0_2_ = uVar1;
      auVar42._4_2_ = uVar1;
      auVar42._6_2_ = uVar1;
      auVar42._8_2_ = uVar1;
      auVar42._10_2_ = uVar1;
      auVar42._12_2_ = uVar1;
      auVar42._14_2_ = uVar1;
      auVar42._16_2_ = uVar1;
      auVar42._18_2_ = uVar1;
      auVar42._20_2_ = uVar1;
      auVar42._22_2_ = uVar1;
      auVar42._24_2_ = uVar1;
      auVar42._26_2_ = uVar1;
      auVar42._28_2_ = uVar1;
      auVar42._30_2_ = uVar1;
      auVar20 = vpmullw_avx2(auVar20,auVar42);
      auVar20 = vpaddw_avx2(auVar20,auVar33);
      auVar31 = vpsraw_avx2(auVar20,0xf);
      auVar20 = vpaddw_avx2(auVar20,auVar12);
      auVar20 = vpaddw_avx2(auVar20,auVar31);
      auVar20 = vpsraw_avx2(auVar20,4);
      auVar20 = vpaddw_avx2(auVar20,auVar14);
      *(undefined1 (*) [16])dest = auVar20._16_16_;
      *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dest + (long)dstride * 2) = auVar20._0_16_;
      dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar7 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar7 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar7 = 0;
      }
    }
    auVar20._2_2_ = auVar21._0_2_;
    auVar20._0_2_ = auVar21._0_2_;
    auVar20._4_2_ = auVar21._0_2_;
    auVar20._6_2_ = auVar21._0_2_;
    auVar20._8_2_ = auVar21._0_2_;
    auVar20._10_2_ = auVar21._0_2_;
    auVar20._12_2_ = auVar21._0_2_;
    auVar20._14_2_ = auVar21._0_2_;
    auVar20._16_2_ = auVar21._0_2_;
    auVar20._18_2_ = auVar21._0_2_;
    auVar20._20_2_ = auVar21._0_2_;
    auVar20._22_2_ = auVar21._0_2_;
    auVar20._24_2_ = auVar21._0_2_;
    auVar20._26_2_ = auVar21._0_2_;
    auVar20._28_2_ = auVar21._0_2_;
    auVar20._30_2_ = auVar21._0_2_;
    lVar4 = (long)dstride;
    lVar8 = lVar6 * -2;
    lVar9 = lVar5 * -2;
    auVar31._8_2_ = 8;
    auVar31._0_8_ = 0x8000800080008;
    auVar31._10_2_ = 8;
    auVar31._12_2_ = 8;
    auVar31._14_2_ = 8;
    auVar31._16_2_ = 8;
    auVar31._18_2_ = 8;
    auVar31._20_2_ = 8;
    auVar31._22_2_ = 8;
    auVar31._24_2_ = 8;
    auVar31._26_2_ = 8;
    auVar31._28_2_ = 8;
    auVar31._30_2_ = 8;
    for (lVar10 = 0; lVar10 < block_height; lVar10 = lVar10 + 4) {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)in;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)in + 0x120);
      auVar13 = vpunpcklqdq_avx(auVar16,auVar13);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)in + 0x240);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)in + 0x360);
      auVar16 = vpunpcklqdq_avx(auVar22,auVar17);
      auVar15._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar16;
      auVar15._16_16_ = ZEXT116(1) * auVar13;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)in + lVar5 * 2);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x120);
      auVar13 = vpunpcklqdq_avx(auVar23,auVar18);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x240);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x360);
      auVar16 = vpunpcklqdq_avx(auVar34,auVar24);
      auVar33._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar16;
      auVar33._16_16_ = ZEXT116(1) * auVar13;
      auVar28 = vpsubw_avx2(auVar33,auVar15);
      auVar21 = vpabsw_avx2(auVar28);
      auVar33 = vpsrlw_avx2(auVar21,ZEXT416(uVar7));
      auVar48 = vpsraw_avx2(auVar28,0xf);
      auVar33 = vpsubusw_avx2(auVar20,auVar33);
      auVar21 = vpminsw_avx2(auVar21,auVar33);
      auVar33 = vpaddw_avx2(auVar21,auVar48);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)((long)in + lVar9);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)((long)in + lVar9 + 0x120);
      auVar13 = vpunpcklqdq_avx(auVar35,auVar25);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)((long)in + lVar9 + 0x240);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)((long)in + lVar9 + 0x360);
      auVar16 = vpunpcklqdq_avx(auVar44,auVar36);
      auVar28._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar16;
      auVar28._16_16_ = ZEXT116(1) * auVar13;
      auVar40 = vpsubw_avx2(auVar28,auVar15);
      auVar21 = vpabsw_avx2(auVar40);
      auVar28 = vpsrlw_avx2(auVar21,ZEXT416(uVar7));
      auVar40 = vpsraw_avx2(auVar40,0xf);
      auVar28 = vpsubusw_avx2(auVar20,auVar28);
      auVar21 = vpminsw_avx2(auVar21,auVar28);
      auVar21 = vpaddw_avx2(auVar21,auVar40);
      auVar21 = vpaddw_avx2(auVar21 ^ auVar40,auVar33 ^ auVar48);
      uVar1 = (undefined2)cdef_pri_taps[bVar11][0];
      auVar40._2_2_ = uVar1;
      auVar40._0_2_ = uVar1;
      auVar40._4_2_ = uVar1;
      auVar40._6_2_ = uVar1;
      auVar40._8_2_ = uVar1;
      auVar40._10_2_ = uVar1;
      auVar40._12_2_ = uVar1;
      auVar40._14_2_ = uVar1;
      auVar40._16_2_ = uVar1;
      auVar40._18_2_ = uVar1;
      auVar40._20_2_ = uVar1;
      auVar40._22_2_ = uVar1;
      auVar40._24_2_ = uVar1;
      auVar40._26_2_ = uVar1;
      auVar40._28_2_ = uVar1;
      auVar40._30_2_ = uVar1;
      auVar28 = vpmullw_avx2(auVar21,auVar40);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)((long)in + lVar6 * 2);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)((long)in + lVar6 * 2 + 0x120);
      auVar13 = vpunpcklqdq_avx(auVar37,auVar26);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)((long)in + lVar6 * 2 + 0x240);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)in + lVar6 * 2 + 0x360);
      auVar16 = vpunpcklqdq_avx(auVar45,auVar38);
      auVar48._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar16;
      auVar48._16_16_ = ZEXT116(1) * auVar13;
      auVar40 = vpsubw_avx2(auVar48,auVar15);
      auVar21 = vpabsw_avx2(auVar40);
      auVar33 = vpsrlw_avx2(auVar21,ZEXT416(uVar7));
      auVar32 = vpsraw_avx2(auVar40,0xf);
      auVar33 = vpsubusw_avx2(auVar20,auVar33);
      auVar21 = vpminsw_avx2(auVar21,auVar33);
      auVar33 = vpaddw_avx2(auVar21,auVar32);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)((long)in + lVar8);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)((long)in + lVar8 + 0x120);
      auVar13 = vpunpcklqdq_avx(auVar46,auVar39);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)((long)in + lVar8 + 0x240);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)((long)in + lVar8 + 0x360);
      auVar16 = vpunpcklqdq_avx(auVar49,auVar47);
      auVar43._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar16;
      auVar43._16_16_ = ZEXT116(1) * auVar13;
      auVar48 = vpsubw_avx2(auVar43,auVar15);
      auVar21 = vpabsw_avx2(auVar48);
      auVar40 = vpsrlw_avx2(auVar21,ZEXT416(uVar7));
      auVar48 = vpsraw_avx2(auVar48,0xf);
      auVar40 = vpsubusw_avx2(auVar20,auVar40);
      auVar21 = vpminsw_avx2(auVar40,auVar21);
      auVar21 = vpaddw_avx2(auVar21,auVar48);
      auVar21 = vpaddw_avx2(auVar21 ^ auVar48,auVar33 ^ auVar32);
      uVar1 = (undefined2)cdef_pri_taps[bVar11][1];
      auVar32._2_2_ = uVar1;
      auVar32._0_2_ = uVar1;
      auVar32._4_2_ = uVar1;
      auVar32._6_2_ = uVar1;
      auVar32._8_2_ = uVar1;
      auVar32._10_2_ = uVar1;
      auVar32._12_2_ = uVar1;
      auVar32._14_2_ = uVar1;
      auVar32._16_2_ = uVar1;
      auVar32._18_2_ = uVar1;
      auVar32._20_2_ = uVar1;
      auVar32._22_2_ = uVar1;
      auVar32._24_2_ = uVar1;
      auVar32._26_2_ = uVar1;
      auVar32._28_2_ = uVar1;
      auVar32._30_2_ = uVar1;
      auVar21 = vpmullw_avx2(auVar21,auVar32);
      auVar21 = vpaddw_avx2(auVar21,auVar28);
      auVar33 = vpsraw_avx2(auVar21,0xf);
      auVar21 = vpaddw_avx2(auVar21,auVar31);
      auVar21 = vpaddw_avx2(auVar21,auVar33);
      auVar21 = vpsraw_avx2(auVar21,4);
      auVar21 = vpaddw_avx2(auVar21,auVar15);
      uVar2 = vpextrq_avx(auVar21._16_16_,1);
      *(undefined8 *)dest = uVar2;
      *(long *)((long)dest + lVar4 * 2) = auVar21._16_8_;
      uVar2 = vpextrq_avx(auVar21._0_16_,1);
      *(undefined8 *)((long)dest + lVar4 * 4) = uVar2;
      *(long *)((long)dest + lVar4 * 6) = auVar21._0_8_;
      dest = (void *)((long)dest + lVar4 * 8);
      in = (uint16_t *)((long)in + 0x480);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_1)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}